

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

Var Js::Math::Ceil(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  CallFlags e;
  BOOL BVar5;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  CallInfo aValue;
  JavascriptLibrary *this_00;
  double value;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  intptr_t intResult_1;
  double result;
  double dblResult;
  double dStack_108;
  int intResult;
  __m128d output;
  __m128d input;
  double x;
  Var inputArg;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  CallInfo local_28;
  CallInfo local_10;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x156,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x157,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pSVar6 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x15a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    this_00 = ScriptContext::GetLibrary(pSVar6);
    callInfo_local = (CallInfo)JavascriptLibraryBase::GetNaN(&this_00->super_JavascriptLibraryBase);
  }
  else {
    aValue = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar3 = TaggedInt::Is((Var)aValue);
    callInfo_local = aValue;
    if (!bVar3) {
      auVar10._0_8_ = JavascriptConversion::ToNumber((Var)aValue,pSVar6);
      BVar5 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
      if (BVar5 == 0) {
        auVar10._8_8_ = 0;
        auVar10 = roundsd(auVar10,auVar10,10);
        value = auVar10._0_8_;
        bVar3 = TaggedInt::IsOverflow((long)value);
        if ((bVar3) || (BVar5 = JavascriptNumber::IsNegZero(value), BVar5 != 0)) {
          callInfo_local = (CallInfo)JavascriptNumber::ToVarNoCheck(value,pSVar6);
        }
        else {
          callInfo_local = (CallInfo)JavascriptNumber::ToVar((long)value,pSVar6);
        }
      }
      else {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar10._0_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = auVar10._0_8_;
        auVar8 = roundsd(auVar8,auVar2,2);
        dStack_108 = auVar8._0_8_;
        iVar4 = (int)ROUND(dStack_108);
        bVar3 = TaggedInt::IsOverflow(iVar4);
        if (((bVar3) || (iVar4 == 0)) || (iVar4 == -0x80000000)) {
          if ((iVar4 == 0) && (BVar5 = JavascriptNumber::IsNegZero(dStack_108), BVar5 == 0)) {
            bVar3 = TaggedInt::IsOverflow(0);
            if (bVar3) {
              local_10 = (CallInfo)JavascriptNumber::NewInlined(0.0,pSVar6);
            }
            else {
              local_10 = (CallInfo)TaggedInt::ToVarUnchecked(0);
            }
            callInfo_local = local_10;
          }
          else {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = auVar10._0_8_;
            auVar10 = roundsd(auVar9,auVar9,10);
            if (((dStack_108 != auVar10._0_8_) || (NAN(dStack_108) || NAN(auVar10._0_8_))) &&
               (BVar5 = JavascriptNumber::IsNan(dStack_108), BVar5 == 0)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                          ,0x180,
                                          "(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult))"
                                          ,
                                          "dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult)"
                                         );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            callInfo_local = (CallInfo)JavascriptNumber::ToVarNoCheck(dStack_108,pSVar6);
          }
        }
        else {
          bVar3 = TaggedInt::IsOverflow(iVar4);
          if (bVar3) {
            local_28 = (CallInfo)JavascriptNumber::NewInlined((double)iVar4,pSVar6);
          }
          else {
            local_28 = (CallInfo)TaggedInt::ToVarUnchecked(iVar4);
          }
          callInfo_local = local_28;
        }
      }
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var Math::Ceil(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count >= 2)
        {
            Var inputArg = args[1];

            if (TaggedInt::Is(inputArg))
            {
                return inputArg;
            }

            double x = JavascriptConversion::ToNumber(inputArg, scriptContext);
#if defined(_M_ARM32_OR_ARM64)
            if (Js::JavascriptNumber::IsNan(x))
            {
                return scriptContext->GetLibrary()->GetNaN();
            }
#endif

#if (defined(_M_IX86) || defined(_M_X64)) \
    && (__SSE4_1__ || _WIN32) // _mm_ceil_sd needs this
            if (AutoSystemInfo::Data.SSE4_1Available())
            {
                __m128d input, output;
                input = _mm_load_sd(&x);
                output = _mm_ceil_sd(input, input);
                int intResult = _mm_cvtsd_si32(output);

                if (TaggedInt::IsOverflow(intResult) || intResult == 0 || intResult == 0x80000000)
                {
                    double dblResult;
                    _mm_store_sd(&dblResult, output);

                    if (intResult == 0 && !JavascriptNumber::IsNegZero(dblResult))
                    {
                        return JavascriptNumber::ToVar(0, scriptContext);
                    }

                    Assert(dblResult == ::ceil(x) || Js::JavascriptNumber::IsNan(dblResult));

                    return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
            else
#endif
            {
                double result = ::ceil(x);

                intptr_t intResult = (intptr_t)result;

                if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(result))
                {
                    return JavascriptNumber::ToVarNoCheck(result, scriptContext);
                }
                else
                {
                    return JavascriptNumber::ToVar(intResult, scriptContext);
                }
            }
        }
        else
        {
            return scriptContext->GetLibrary()->GetNaN();
        }
    }